

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

bool libtorrent::path_equal(string *lhs,string *rhs)

{
  int iVar1;
  string *psVar2;
  
  psVar2 = (string *)lhs->_M_string_length;
  if ((psVar2 != (string *)0x0) && (psVar2[(long)((lhs->_M_dataplus)._M_p + -1)] == (string)0x2f)) {
    psVar2 = psVar2 + -1;
  }
  iVar1 = ::std::__cxx11::string::compare((ulong)lhs,0,psVar2,(ulong)rhs,0);
  return iVar1 == 0;
}

Assistant:

bool path_equal(std::string const& lhs, std::string const& rhs)
	{
		std::string::size_type const lhs_size = !lhs.empty()
			&& (lhs[lhs.size()-1] == '/'
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
			|| lhs[lhs.size()-1] == '\\'
#endif
			) ? lhs.size() - 1 : lhs.size();

		std::string::size_type const rhs_size = !rhs.empty()
			&& (rhs[rhs.size()-1] == '/'
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
			|| rhs[rhs.size()-1] == '\\'
#endif
			) ? rhs.size() - 1 : rhs.size();
		return lhs.compare(0, lhs_size, rhs, 0, rhs_size) == 0;
	}